

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.hpp
# Opt level: O0

void __thiscall
antlr::RefCount<antlr::LexerInputState>::~RefCount(RefCount<antlr::LexerInputState> *this)

{
  bool bVar1;
  long *in_RDI;
  Ref *this_00;
  
  if (((*in_RDI != 0) && (bVar1 = Ref::decrement((Ref *)*in_RDI), bVar1)) &&
     (this_00 = (Ref *)*in_RDI, this_00 != (Ref *)0x0)) {
    Ref::~Ref(this_00);
    operator_delete(this_00,0x10);
  }
  return;
}

Assistant:

~RefCount()
	{
		if (ref && ref->decrement())
			delete ref;
	}